

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationrootelements.cpp
# Opt level: O0

int32_t __thiscall icu_63::CollationRootElements::findP(CollationRootElements *this,uint32_t p)

{
  uint32_t local_28;
  uint local_24;
  int32_t j;
  uint32_t q;
  int32_t i;
  int32_t limit;
  int32_t start;
  uint32_t p_local;
  CollationRootElements *this_local;
  
  i = this->elements[2];
  q = this->length - 1;
  do {
    if ((int)q <= i + 1) {
      return i;
    }
    j = (int)(i + q) / 2;
    local_24 = this->elements[j];
    local_28 = j;
    if ((local_24 & 0x80) != 0) {
      do {
        local_28 = local_28 + 1;
        if (local_28 == q) goto LAB_002b2a5d;
        local_24 = this->elements[(int)local_28];
      } while ((local_24 & 0x80) != 0);
      j = local_28;
LAB_002b2a5d:
      local_28 = j;
      if ((local_24 & 0x80) != 0) {
        do {
          local_28 = local_28 + -1;
          if (local_28 == i) goto LAB_002b2aae;
          local_24 = this->elements[(int)local_28];
        } while ((local_24 & 0x80) != 0);
        j = local_28;
LAB_002b2aae:
        if ((local_24 & 0x80) != 0) {
          return i;
        }
      }
    }
    if (p < (local_24 & 0xffffff00)) {
      q = j;
    }
    else {
      i = j;
    }
  } while( true );
}

Assistant:

int32_t
CollationRootElements::findP(uint32_t p) const {
    // p need not occur as a root primary.
    // For example, it might be a reordering group boundary.
    U_ASSERT((p >> 24) != Collation::UNASSIGNED_IMPLICIT_BYTE);
    // modified binary search
    int32_t start = (int32_t)elements[IX_FIRST_PRIMARY_INDEX];
    U_ASSERT(p >= elements[start]);
    int32_t limit = length - 1;
    U_ASSERT(elements[limit] >= PRIMARY_SENTINEL);
    U_ASSERT(p < elements[limit]);
    while((start + 1) < limit) {
        // Invariant: elements[start] and elements[limit] are primaries,
        // and elements[start]<=p<=elements[limit].
        int32_t i = (start + limit) / 2;
        uint32_t q = elements[i];
        if((q & SEC_TER_DELTA_FLAG) != 0) {
            // Find the next primary.
            int32_t j = i + 1;
            for(;;) {
                if(j == limit) { break; }
                q = elements[j];
                if((q & SEC_TER_DELTA_FLAG) == 0) {
                    i = j;
                    break;
                }
                ++j;
            }
            if((q & SEC_TER_DELTA_FLAG) != 0) {
                // Find the preceding primary.
                j = i - 1;
                for(;;) {
                    if(j == start) { break; }
                    q = elements[j];
                    if((q & SEC_TER_DELTA_FLAG) == 0) {
                        i = j;
                        break;
                    }
                    --j;
                }
                if((q & SEC_TER_DELTA_FLAG) != 0) {
                    // No primary between start and limit.
                    break;
                }
            }
        }
        if(p < (q & 0xffffff00)) {  // Reset the "step" bits of a range end primary.
            limit = i;
        } else {
            start = i;
        }
    }
    return start;
}